

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  char *text_end;
  ImVec2 size;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar6 = GImGui;
  BeginTooltipEx(0,1);
  if (text != (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
    if (text < text_end) {
      TextEx(text,text_end,0);
      if (GImGui->CurrentWindow->SkipItems == false) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
    }
  }
  fVar1 = (pIVar6->Style).FramePadding.y;
  fVar2 = pIVar6->FontSize * 3.0 + fVar1 + fVar1;
  local_48._8_8_ = 0;
  local_48._0_8_ = *(ulong *)col;
  fVar1 = col[2];
  local_58.w = 1.0;
  if ((flags & 2U) == 0) {
    local_58.w = col[3];
  }
  size.y = fVar2;
  size.x = fVar2;
  local_58._0_8_ = vmovlps_avx(local_48);
  if ((flags & 2U) == 0) {
    auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)col[3]));
    auVar3 = vcmpss_avx(ZEXT416((uint)col[3]),ZEXT816(0) << 0x20,1);
    vandnps_avx(auVar3,auVar4);
  }
  local_58.z = fVar1;
  ColorButton("##preview",&local_58,flags & 0x18060002U | 0x40,size);
  SameLine(0.0,-1.0);
  dVar7 = (double)*col;
  dVar8 = (double)col[1];
  dVar9 = (double)col[2];
  if ((flags & 0x18000000U) == 0x10000000) {
    if ((flags & 2U) == 0) {
      Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f",dVar7,dVar8,dVar9,(double)col[3]);
    }
    else {
      Text("H: %.3f, S: %.3f, V: %.3f",dVar7,dVar8,dVar9);
    }
  }
  else {
    auVar5 = vmovshdup_avx(local_48);
    auVar10 = SUB6416(ZEXT464(0x3f800000),0);
    auVar4 = vminss_avx(auVar10,local_48);
    auVar11 = ZEXT816(0) << 0x40;
    auVar3 = vcmpss_avx(local_48,auVar11,1);
    vandnps_avx(auVar3,auVar4);
    auVar4 = vminss_avx(auVar10,auVar5);
    auVar3 = vcmpss_avx(auVar5,auVar11,1);
    vandnps_avx(auVar3,auVar4);
    auVar4 = vminss_avx(auVar10,ZEXT416((uint)fVar1));
    auVar3 = vcmpss_avx(ZEXT416((uint)fVar1),auVar11,1);
    vandnps_avx(auVar3,auVar4);
    if ((flags & 2U) == 0) {
      Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",dVar7,dVar8,dVar9,
           (double)col[3]);
    }
    else {
      Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",dVar7,dVar8,dVar9);
    }
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(0, ImGuiTooltipFlags_OverridePreviousTooltip);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags__InputMask))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}